

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O2

ClausePtr __thiscall Satyricon::SATSolver::propagation(SATSolver *this)

{
  uint uVar1;
  literal_value lVar2;
  pointer pWVar3;
  value_type vVar4;
  pointer plVar5;
  ClausePtr pCVar6;
  bool bVar7;
  ostream *poVar8;
  uint uVar9;
  pointer pLVar10;
  ulong uVar11;
  long lVar12;
  literal_value lVar13;
  anon_union_8_2_f7e3ed0a_for_Watcher_0 *__x;
  uint uVar14;
  ulong uVar15;
  string local_50;
  
  do {
    uVar15 = this->propagation_starting_pos;
    pLVar10 = (this->trail).
              super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->trail).
                      super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pLVar10 >> 2) <= uVar15) {
      return (ClausePtr)0x0;
    }
    if (1 < this->log_level) {
      poVar8 = std::operator<<((ostream *)&std::cout,"propagate ");
      poVar8 = operator<<(poVar8,(this->trail).
                                 super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>
                                 ._M_impl.super__Vector_impl_data._M_start +
                                 this->propagation_starting_pos);
      std::endl<char,std::char_traits<char>>(poVar8);
      uVar15 = this->propagation_starting_pos;
      pLVar10 = (this->trail).
                super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    this->propagation_starting_pos = uVar15 + 1;
    uVar9 = pLVar10[uVar15].value;
    pWVar3 = (this->propagation_to_move).
             super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->propagation_to_move).
        super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
        ._M_impl.super__Vector_impl_data._M_finish != pWVar3) {
      (this->propagation_to_move).
      super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
      ._M_impl.super__Vector_impl_data._M_finish = pWVar3;
    }
    uVar15 = (ulong)uVar9 ^ 1;
    std::_Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
    ::_Vector_impl_data::_M_swap_data
              ((_Vector_impl_data *)&this->propagation_to_move,
               (_Vector_impl_data *)
               ((this->watch_list).
                super__Vector_base<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar15));
    for (__x = &((this->propagation_to_move).
                 super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
                 ._M_impl.super__Vector_impl_data._M_start)->field_0;
        __x != &((this->propagation_to_move).
                 super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->field_0; __x = __x + 1) {
      vVar4.field_0 = (anon_union_8_2_f7e3ed0a_for_Watcher_0)__x->clause;
      uVar9 = *(uint *)((long)vVar4.field_0 + 8);
      uVar1 = *(uint *)((long)vVar4.field_0 + 0xc);
      uVar14 = (uint)uVar15;
      if (uVar9 == uVar14) {
        *(uint *)((long)vVar4.field_0 + 8) = uVar1;
        *(uint *)((long)vVar4.field_0 + 0xc) = uVar14;
        uVar9 = uVar1;
      }
      else if (uVar1 != uVar14) {
        __assert_fail("c[0]==failed || c[1]==failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/src/sat_solver.cpp"
                      ,0x14f,"SATSolver::ClausePtr Satyricon::SATSolver::propagation()");
      }
      plVar5 = (this->values).
               super__Vector_base<Satyricon::literal_value,_std::allocator<Satyricon::literal_value>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = plVar5[uVar9 >> 1];
      lVar13 = LIT_TRUE - lVar2;
      if ((uVar9 & 1) == 0) {
        lVar13 = lVar2;
      }
      uVar11 = uVar15;
      if (lVar13 == LIT_TRUE) {
LAB_001131c5:
        std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>::
        push_back((this->watch_list).
                  super__Vector_base<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar11,(value_type *)__x);
      }
      else {
        for (lVar12 = 0; (ulong)(*(uint *)vVar4.field_0 >> 1) - 2 != lVar12; lVar12 = lVar12 + 1) {
          uVar9 = ((uint *)((long)vVar4.field_0 + 0x10))[lVar12];
          lVar2 = plVar5[uVar9 >> 1];
          lVar13 = LIT_TRUE - lVar2;
          if ((uVar9 & 1) == 0) {
            lVar13 = lVar2;
          }
          if (lVar13 != LIT_FALSE) {
            *(uint *)((long)vVar4.field_0 + 0xc) = uVar9;
            ((uint *)((long)vVar4.field_0 + 0x10))[lVar12] = uVar14;
            uVar11 = (ulong)*(uint *)((long)vVar4.field_0 + 0xc);
            goto LAB_001131c5;
          }
        }
        std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>::
        push_back((this->watch_list).
                  super__Vector_base<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar15,(value_type *)__x);
        bVar7 = assign(this,(Literal)*(uint *)((long)vVar4.field_0 + 8),__x->clause);
        if (bVar7) {
          if (1 < this->log_level) {
            poVar8 = std::operator<<((ostream *)&std::cout,"\tfound a conflict on ");
            Clause::print_abi_cxx11_(&local_50,__x->clause);
            poVar8 = std::operator<<(poVar8,(string *)&local_50);
            std::endl<char,std::char_traits<char>>(poVar8);
            std::__cxx11::string::~string((string *)&local_50);
          }
          pCVar6 = __x->clause;
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<Satyricon::SATSolver::Watcher*,std::back_insert_iterator<std::vector<Satyricon::SATSolver::Watcher,std::allocator<Satyricon::SATSolver::Watcher>>>>
                    ((Watcher *)(__x + 1),
                     (this->propagation_to_move).
                     super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (this->watch_list).
                     super__Vector_base<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar15);
          return pCVar6;
        }
      }
    }
  } while( true );
}

Assistant:

SATSolver::ClausePtr SATSolver::propagation() {

    while ( propagation_starting_pos < trail.size() ) {

        PRINT_VERBOSE("propagate " << trail[propagation_starting_pos] << endl);

        // extract the list of the opposite literal 
        // (they are false now, their watcher must be moved)
        auto failed = !trail[propagation_starting_pos++];
        propagation_to_move.clear();
        swap(propagation_to_move,watch_list[failed.index()]);

        for (auto it = propagation_to_move.begin();
                it != propagation_to_move.end(); ++it) {

            // propagate effect on a clause
            Clause &c = *(it->get_clause()); // usefull reference
            assert(c[0]==failed || c[1]==failed);

            // make sure the false literal is in position 1
            if ( c[0] == failed ) { c[0] = c[1]; c[1] = failed; }

            // if the clause is already solved, nothing need to be moved
            if (get_asigned_value(c[0]) == LIT_TRUE) {
                // reinsert inside the previous watch list
                watch_list[failed.index()].push_back(*it);
                continue; // move to the next
            }

            // search a new literal to watch
            bool foundt_new_watch = false;
            for ( size_t pos = 2; pos != c.size(); ++pos) {
                if ( get_asigned_value(c[pos]) != LIT_FALSE ) {
                    // swap value
                    c[1] = c[pos]; c[pos] = failed;
                    // insert in the new watch list
                    watch_list[c[1].index()].push_back(*it);
                    // move to the next
                    foundt_new_watch = true;
                    break;
                }
            }
            if ( foundt_new_watch ) continue; // move to the next

            // no new literal to watch, reinsert in the old position
            watch_list[failed.index()].push_back(*it);

            // the clause must be a conflict or a unit, try to assign the value
            bool conflict = assign(c[0],it->get_clause());
            if ( ! conflict ) continue; // no problem, move to the next

            // conflict found in propagation 
            PRINT_VERBOSE("\tfound a conflict on " << (it->get_clause())->print() << endl);
            ClausePtr conflict_clause = it->get_clause();

            // reset the other literal to move (it is already set by propagate)
            copy(++it, propagation_to_move.end(),
                    back_inserter(watch_list[failed.index()]));

            return conflict_clause;
        }
    }
    return nullptr; // no conflict
}